

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O2

void helper_sve_trn_p_aarch64(void *vd,void *vn,void *vm,uint32_t pred_desc)

{
  byte bVar1;
  uint uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = pred_desc >> 10 & 3;
  bVar1 = (byte)(1 << (sbyte)uVar2);
  uVar4 = 0;
  bVar3 = 0;
  if ((pred_desc >> 0xc & 1) == 0) {
    bVar3 = bVar1;
  }
  bVar1 = bVar1 & (byte)((int)(pred_desc << 0x13) >> 0x1f);
  uVar5 = even_bit_esz_masks[uVar2] << (bVar1 & 0x3f);
  for (; (pred_desc & 0x1f) + 9 >> 3 != uVar4; uVar4 = uVar4 + 1) {
    *(ulong *)((long)vd + uVar4 * 8) =
         ((*(ulong *)((long)vm + uVar4 * 8) & uVar5) << (bVar3 & 0x3f)) +
         ((*(ulong *)((long)vn + uVar4 * 8) & uVar5) >> (bVar1 & 0x3f));
  }
  return;
}

Assistant:

void HELPER(sve_trn_p)(void *vd, void *vn, void *vm, uint32_t pred_desc)
{
    intptr_t oprsz = extract32(pred_desc, 0, SIMD_OPRSZ_BITS) + 2;
    uintptr_t esz = extract32(pred_desc, SIMD_DATA_SHIFT, 2);
    bool odd = extract32(pred_desc, SIMD_DATA_SHIFT + 2, 1);
    uint64_t *d = vd, *n = vn, *m = vm;
    uint64_t mask;
    int shr, shl;
    intptr_t i;

    shl = 1 << esz;
    shr = 0;
    mask = even_bit_esz_masks[esz];
    if (odd) {
        mask <<= shl;
        shr = shl;
        shl = 0;
    }

    for (i = 0; i < DIV_ROUND_UP(oprsz, 8); i++) {
        uint64_t nn = (n[i] & mask) >> shr;
        uint64_t mm = (m[i] & mask) << shl;
        d[i] = nn + mm;
    }
}